

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

arrays_type * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*,_void>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>_>_>_>
::new_arrays_for_growth
          (arrays_type *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*,_void>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>_>_>_>
          *this)

{
  ulong uVar1;
  float fVar2;
  
  uVar1 = (this->size_ctrl).size;
  fVar2 = ceilf((float)(uVar1 / 0x3d + uVar1 + 1) / 0.875);
  new_arrays(__return_storage_ptr__,this,
             (long)(fVar2 - 9.223372e+18) & (long)fVar2 >> 0x3f | (long)fVar2);
  return __return_storage_ptr__;
}

Assistant:

arrays_type new_arrays_for_growth() const {
        /* Due to the anti-drift mechanism (see recover_slot), the new arrays may
         * be of the same size as the old arrays; in the limit, erasing one
         * element at full load and then inserting could bring us back to the same
         * capacity after a costly rehash. To avoid this, we jump to the next
         * capacity level when the number of erased elements is <= 10% of total
         * elements at full load, which is implemented by requesting additional
         * F*size elements, with F = P * 10% / (1 - P * 10%), where P is the
         * probability of an element having caused overflow; P has been measured as
         * ~0.162 under ideal conditions, yielding F ~ 0.0165 ~ 1/61.
         */
        return new_arrays(
            std::size_t(std::ceil(static_cast<float>(size() + size() / 61 + 1) / mlf)));
    }